

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  char *pcVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first_02;
  value_type vVar2;
  bool bVar3;
  reference pvVar4;
  int *piVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  unsigned_long_long *val_00;
  reference this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  void *pvVar10;
  vector<long_long,_std::allocator<long_long>_> *this_00;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  int i_2;
  uint dataLen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header_1;
  unsigned_long_long outSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  uint *linePtr_4;
  uint val_2;
  int x_4;
  int y_4;
  float *linePtr_3;
  float val_1;
  int x_3;
  int y_3;
  unsigned_short *linePtr_2;
  FP16 h16_1;
  FP32 f32_1;
  int x_2;
  int y_2;
  unsigned_short *linePtr_1;
  unsigned_short val;
  int x_1;
  int y_1;
  float *linePtr;
  FP32 f32;
  FP16 h16;
  int x;
  int y;
  int c_2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  int h;
  int endY;
  int startY;
  int i_1;
  int c_1;
  size_t channelOffset;
  int pixelDataSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  bool isBigEndian;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  longlong offset;
  size_t headerSize;
  vector<long_long,_std::allocator<long_long>_> offsets;
  int numBlocks;
  uchar e;
  int i;
  float w;
  float center [2];
  float aspectRatio;
  uchar lineOrder;
  int data_2 [4];
  int compressionType;
  ChannelInfo info;
  int c;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data_1;
  int numScanlineBlocks;
  char marker [4];
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa28;
  vector<long_long,_std::allocator<long_long>_> *in_stack_fffffffffffffa30;
  value_type *in_stack_fffffffffffffa38;
  allocator_type *in_stack_fffffffffffffa40;
  size_type in_stack_fffffffffffffa48;
  vector<long_long,_std::allocator<long_long>_> *in_stack_fffffffffffffa50;
  uchar *in_stack_fffffffffffffa60;
  char *in_stack_fffffffffffffa68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffa70;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffa78;
  undefined7 in_stack_fffffffffffffa80;
  undefined1 in_stack_fffffffffffffa87;
  const_iterator in_stack_fffffffffffffa88;
  undefined8 in_stack_fffffffffffffad0;
  iterator in_stack_fffffffffffffad8;
  uint *in_stack_fffffffffffffae0;
  unsigned_long_long *in_stack_fffffffffffffae8;
  undefined7 in_stack_fffffffffffffaf0;
  undefined1 in_stack_fffffffffffffaf7;
  int local_354;
  undefined4 local_2d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2c8;
  reference local_2b0;
  uint local_2a4;
  int local_2a0;
  int local_29c;
  reference local_298;
  uint local_28c;
  int local_288;
  int local_284;
  reference local_280;
  FP32 local_278;
  FP16 local_274;
  FP16 local_270;
  FP32 local_26c;
  int local_268;
  int local_264;
  reference local_260;
  unsigned_short local_252;
  int local_250;
  int local_24c;
  reference local_248;
  FP16 local_23c;
  FP32 local_238;
  FP16 local_234;
  int local_230;
  int local_22c;
  int local_228;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_220;
  int local_208;
  int local_204;
  int local_200;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  value_type local_1f0;
  int local_1e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1e0;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_1c0;
  byte local_1a1;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  *local_188;
  size_type local_180;
  vector<long_long,_std::allocator<long_long>_> local_170;
  int local_158;
  undefined1 local_151;
  int local_150;
  float local_14c;
  uint local_148 [3];
  undefined1 local_139;
  uint local_138 [3];
  uint local_12c [3];
  uint local_120;
  allocator local_119;
  string local_118 [32];
  string local_f8 [32];
  undefined4 local_d8;
  undefined1 local_d4;
  undefined4 local_d0;
  undefined4 local_cc;
  int local_c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  int local_8c;
  uchar *local_88;
  uchar *local_80;
  undefined4 local_6c;
  uchar *local_68;
  uchar *local_50;
  undefined4 local_3c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  undefined8 *local_18;
  long local_10;
  size_type local_8;
  
  if ((in_RDI == 0) || (in_RSI == (undefined8 *)0x0)) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.";
    }
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x196298);
    local_3c = 0x1312f76;
    local_50 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  (in_stack_fffffffffffffa28);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa30,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa28);
    local_68 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<char_const*,void>
                                  (in_stack_fffffffffffffa70,in_stack_fffffffffffffa78._M_current,
                                   in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60);
    local_6c = 2;
    local_80 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  (in_stack_fffffffffffffa28);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa30,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa28);
    local_88 = (uchar *)std::vector<unsigned_char,std::allocator<unsigned_char>>::
                        insert<char_const*,void>
                                  (in_stack_fffffffffffffa70,in_stack_fffffffffffffa78._M_current,
                                   in_stack_fffffffffffffa68,(char *)in_stack_fffffffffffffa60);
    local_8c = 0x10;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1963a0);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              *)0x1963ad);
    for (local_c4 = 0; local_c4 < *(int *)(local_10 + 0x1004); local_c4 = local_c4 + 1) {
      anon_unknown.dwarf_d1289::anon_struct_48_5_91bcb76e::ChannelInfo
                ((anon_struct_48_5_91bcb76e *)0x1963e0);
      local_d4 = 0;
      local_d8 = *(undefined4 *)(*(long *)(local_10 + 0x1020) + (long)local_c4 * 4);
      local_d0 = 1;
      local_cc = 1;
      pcVar1 = *(char **)(*(long *)(local_10 + 0x1008) + (long)local_c4 * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,pcVar1,&local_119);
      std::__cxx11::string::operator=(local_f8,local_118);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
      anon_unknown.dwarf_d1289::anon_struct_48_5_91bcb76e::~ChannelInfo
                ((anon_struct_48_5_91bcb76e *)0x1964d9);
    }
    anon_unknown.dwarf_d1289::WriteChannelInfo
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffa87,in_stack_fffffffffffffa80),
               (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                *)in_stack_fffffffffffffa78._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa30,
               (size_type)in_stack_fffffffffffffa28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_a8);
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
               *)in_stack_fffffffffffffa40);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa40);
    local_120 = 3;
    bVar3 = anon_unknown.dwarf_d1289::IsBigEndian();
    if (bVar3) {
      anon_unknown.dwarf_d1289::swap4(&local_120);
    }
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    local_138[0] = 0;
    local_138[1] = 0;
    local_138[2] = *(int *)(local_10 + 0x1028) + -1;
    local_12c[0] = *(int *)(local_10 + 0x102c) - 1;
    bVar3 = anon_unknown.dwarf_d1289::IsBigEndian();
    if (bVar3) {
      anon_unknown.dwarf_d1289::swap4(local_138);
      anon_unknown.dwarf_d1289::swap4(local_138 + 1);
      anon_unknown.dwarf_d1289::swap4(local_138 + 2);
      anon_unknown.dwarf_d1289::swap4(local_12c);
    }
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    local_139 = 0;
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    local_148[2] = 0x3f800000;
    bVar3 = anon_unknown.dwarf_d1289::IsBigEndian();
    if (bVar3) {
      anon_unknown.dwarf_d1289::swap4(local_148 + 2);
    }
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    local_148[0] = 0;
    local_148[1] = 0;
    bVar3 = anon_unknown.dwarf_d1289::IsBigEndian();
    if (bVar3) {
      anon_unknown.dwarf_d1289::swap4(local_148);
      anon_unknown.dwarf_d1289::swap4(local_148 + 1);
    }
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    local_14c = (float)*(int *)(local_10 + 0x1028);
    bVar3 = anon_unknown.dwarf_d1289::IsBigEndian();
    if (bVar3) {
      anon_unknown.dwarf_d1289::swap4((uint *)&local_14c);
    }
    anon_unknown.dwarf_d1289::WriteAttributeToMemory
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
               (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
               in_stack_fffffffffffffad8._M_current,(int)((ulong)in_stack_fffffffffffffad0 >> 0x20))
    ;
    if (0 < *(int *)(local_10 + 0x1000)) {
      printf("custom\n");
      for (local_150 = 0; local_150 < *(int *)(local_10 + 0x1000); local_150 = local_150 + 1) {
        anon_unknown.dwarf_d1289::WriteAttributeToMemory
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                   (char *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
                   in_stack_fffffffffffffad8._M_current,
                   (int)((ulong)in_stack_fffffffffffffad0 >> 0x20));
      }
    }
    local_151 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa40,
               (value_type_conflict4 *)in_stack_fffffffffffffa38);
    local_158 = *(int *)(local_10 + 0x102c) / local_8c;
    if (local_158 * local_8c < *(int *)(local_10 + 0x102c)) {
      local_158 = local_158 + 1;
    }
    std::allocator<long_long>::allocator((allocator<long_long> *)0x1969ea);
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
               (allocator_type *)in_stack_fffffffffffffa40);
    std::allocator<long_long>::~allocator((allocator<long_long> *)0x196a16);
    local_180 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_38);
    local_188 = (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 *)(local_180 + (long)local_158 * 8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x196a54);
    local_1a1 = anon_unknown.dwarf_d1289::IsBigEndian();
    std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::allocator
              ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x196a97);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,
             (allocator_type *)in_stack_fffffffffffffa40);
    std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::~allocator
              ((allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *)0x196ac3);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x196aef);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48,(allocator_type *)in_stack_fffffffffffffa40);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x196b1b);
    local_1e8 = 0;
    local_1f0 = 0;
    for (local_1f4 = 0; vVar2 = local_1f0, local_1f4 < *(int *)(local_10 + 0x1004);
        local_1f4 = local_1f4 + 1) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_1e0,(long)local_1f4);
      *pvVar4 = vVar2;
      if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_1f4 * 4) == 1) {
        local_1e8 = local_1e8 + 2;
        local_1f0 = local_1f0 + 2;
      }
      else {
        if ((*(int *)(*(long *)(local_10 + 0x1020) + (long)local_1f4 * 4) != 2) &&
           (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_1f4 * 4) != 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x26f0,
                        "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                       );
        }
        local_1e8 = local_1e8 + 4;
        local_1f0 = local_1f0 + 4;
      }
    }
    for (local_1f8 = 0; local_1f8 < local_158; local_1f8 = local_1f8 + 1) {
      local_1fc = local_8c * local_1f8;
      local_204 = local_8c * (local_1f8 + 1);
      piVar5 = std::min<int>(&local_204,(int *)(local_10 + 0x102c));
      local_200 = *piVar5;
      local_208 = local_200 - local_1fc;
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x196e07);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa50,
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x196e33);
      for (local_228 = 0; local_228 < *(int *)(local_10 + 0x1004); local_228 = local_228 + 1) {
        if (*(int *)(*(long *)(local_10 + 0x1018) + (long)local_228 * 4) == 1) {
          if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) == 2) {
            for (local_22c = 0; local_22c < local_208; local_22c = local_22c + 1) {
              for (local_230 = 0; local_230 < *(int *)(local_10 + 0x1028); local_230 = local_230 + 1
                  ) {
                local_234.u = *(undefined2 *)
                               (*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8) +
                               (long)((local_22c + local_1fc) * *(int *)(local_10 + 0x1028) +
                                     local_230) * 2);
                local_23c = local_234;
                local_238 = anon_unknown.dwarf_d1289::half_to_float(local_234);
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_d1289::swap4(&local_238.u);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_248 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffffa30,
                                       (size_type)in_stack_fffffffffffffa28);
                *(FP32 *)(local_248 + (long)local_230 * 4) = local_238;
              }
            }
          }
          else {
            if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) != 1) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x2728,
                            "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                           );
            }
            for (local_24c = 0; local_24c < local_208; local_24c = local_24c + 1) {
              for (local_250 = 0; local_250 < *(int *)(local_10 + 0x1028); local_250 = local_250 + 1
                  ) {
                local_252 = *(unsigned_short *)
                             (*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8) +
                             (long)((local_24c + local_1fc) * *(int *)(local_10 + 0x1028) +
                                   local_250) * 2);
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_d1289::swap2(&local_252);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_260 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffffa30,
                                       (size_type)in_stack_fffffffffffffa28);
                *(unsigned_short *)(local_260 + (long)local_250 * 2) = local_252;
              }
            }
          }
        }
        else if (*(int *)(*(long *)(local_10 + 0x1018) + (long)local_228 * 4) == 2) {
          if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) == 1) {
            for (local_264 = 0; local_264 < local_208; local_264 = local_264 + 1) {
              for (local_268 = 0; local_268 < *(int *)(local_10 + 0x1028); local_268 = local_268 + 1
                  ) {
                local_278 = *(FP32 *)(*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8)
                                     + (long)((local_264 + local_1fc) * *(int *)(local_10 + 0x1028)
                                             + local_268) * 4);
                local_26c = local_278;
                local_274 = anon_unknown.dwarf_d1289::float_to_half_full(local_278);
                local_270 = local_274;
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_d1289::swap2(&local_270.u);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_280 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffffa30,
                                       (size_type)in_stack_fffffffffffffa28);
                *(unsigned_short *)(local_280 + (long)local_268 * 2) = local_270.u;
              }
            }
          }
          else {
            if (*(int *)(*(long *)(local_10 + 0x1020) + (long)local_228 * 4) != 2) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                            ,0x2755,
                            "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                           );
            }
            for (local_284 = 0; local_284 < local_208; local_284 = local_284 + 1) {
              for (local_288 = 0; local_288 < *(int *)(local_10 + 0x1028); local_288 = local_288 + 1
                  ) {
                local_28c = *(uint *)(*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8)
                                     + (long)((local_284 + local_1fc) * *(int *)(local_10 + 0x1028)
                                             + local_288) * 4);
                if ((local_1a1 & 1) != 0) {
                  anon_unknown.dwarf_d1289::swap4(&local_28c);
                }
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          (&local_1e0,(long)local_228);
                local_298 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       in_stack_fffffffffffffa30,
                                       (size_type)in_stack_fffffffffffffa28);
                *(uint *)(local_298 + (long)local_288 * 4) = local_28c;
              }
            }
          }
        }
        else if (*(int *)(*(long *)(local_10 + 0x1018) + (long)local_228 * 4) == 0) {
          for (local_29c = 0; local_29c < local_208; local_29c = local_29c + 1) {
            for (local_2a0 = 0; local_2a0 < *(int *)(local_10 + 0x1028); local_2a0 = local_2a0 + 1)
            {
              local_2a4 = *(uint *)(*(long *)(*(long *)(local_10 + 0x1010) + (long)local_228 * 8) +
                                   (long)((local_29c + local_1fc) * *(int *)(local_10 + 0x1028) +
                                         local_2a0) * 4);
              if ((local_1a1 & 1) != 0) {
                anon_unknown.dwarf_d1289::swap4(&local_2a4);
              }
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&local_1e0,(long)local_228);
              local_2b0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28)
              ;
              *(uint *)(local_2b0 + (long)local_2a0 * 4) = local_2a4;
            }
          }
        }
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_220);
      mz_compressBound(0x19781a);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x197837);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa50,
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x197863);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_2c8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa30,
                 (size_type)in_stack_fffffffffffffa28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa30,
                 (size_type)in_stack_fffffffffffffa28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_220);
      anon_unknown.dwarf_d1289::CompressZip
                ((uchar *)CONCAT17(in_stack_fffffffffffffaf7,in_stack_fffffffffffffaf0),
                 in_stack_fffffffffffffae8,(uchar *)in_stack_fffffffffffffae0,
                 (unsigned_long)in_stack_fffffffffffffad8._M_current);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1978fa);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa50,
                 in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x197923);
      local_2d8 = (undefined4)sVar6;
      piVar5 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
      *piVar5 = local_1fc;
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
      *(undefined4 *)pvVar7 = local_2d8;
      in_stack_fffffffffffffaf7 = anon_unknown.dwarf_d1289::IsBigEndian();
      if ((bool)in_stack_fffffffffffffaf7) {
        in_stack_fffffffffffffae8 =
             (unsigned_long_long *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
        anon_unknown.dwarf_d1289::swap4((uint *)in_stack_fffffffffffffae8);
        in_stack_fffffffffffffae0 =
             (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
        anon_unknown.dwarf_d1289::swap4(in_stack_fffffffffffffae0);
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](&local_1c0,(long)local_1f8);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](&local_1c0,(long)local_1f8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffa30,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffa28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffa28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
      __first._M_current._7_1_ = in_stack_fffffffffffffa87;
      __first._M_current._0_7_ = in_stack_fffffffffffffa80;
      in_stack_fffffffffffffad8 =
           std::vector<unsigned_char,std::allocator<unsigned_char>>::
           insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                     (in_stack_fffffffffffffa70,in_stack_fffffffffffffa88,__first,
                      in_stack_fffffffffffffa78);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](&local_1c0,(long)local_1f8);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[](&local_1c0,(long)local_1f8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffa30,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffa28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffa28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffa28);
      __gnu_cxx::
      __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator+((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)in_stack_fffffffffffffa38,(difference_type)in_stack_fffffffffffffa30);
      __first_00._M_current._7_1_ = in_stack_fffffffffffffa87;
      __first_00._M_current._0_7_ = in_stack_fffffffffffffa80;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa88,__first_00,
                 in_stack_fffffffffffffa78);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa40)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa40)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffa40)
      ;
    }
    for (local_354 = 0; local_354 < local_158; local_354 = local_354 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffa30,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffa28);
      in_stack_fffffffffffffa88._M_current = (uchar *)&local_1c0;
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffa88._M_current,(long)local_354);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffa28);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffa88._M_current,(long)local_354);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
      __first_01._M_current._7_1_ = in_stack_fffffffffffffa87;
      __first_01._M_current._0_7_ = in_stack_fffffffffffffa80;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                (in_stack_fffffffffffffa70,in_stack_fffffffffffffa88,__first_01,
                 in_stack_fffffffffffffa78);
      in_stack_fffffffffffffa78._M_current = (uchar *)local_188;
      pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::operator[]
                         (&local_170,(long)local_354);
      *pvVar8 = (value_type)in_stack_fffffffffffffa78._M_current;
      in_stack_fffffffffffffa87 = anon_unknown.dwarf_d1289::IsBigEndian();
      if ((bool)in_stack_fffffffffffffa87) {
        val_00 = (unsigned_long_long *)
                 std::vector<long_long,_std::allocator<long_long>_>::operator[]
                           (&local_170,(long)local_354);
        anon_unknown.dwarf_d1289::swap8(val_00);
      }
      this = std::
             vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::operator[](&local_1c0,(long)local_354);
      sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
      local_188 = (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)((long)&(local_188->
                             super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             )._M_impl.super__Vector_impl_data._M_start + sVar6);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa30,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa28);
    pvVar9 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<long_long,_std::allocator<long_long>_>::at
                       (in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
    pvVar8 = std::vector<long_long,_std::allocator<long_long>_>::at
                       (in_stack_fffffffffffffa30,(size_type)in_stack_fffffffffffffa28);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
              (pvVar9,(const_iterator)in_stack_fffffffffffffa78._M_current,(uchar *)pvVar8,
               in_stack_fffffffffffffa60);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa30,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)in_stack_fffffffffffffa28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(in_stack_fffffffffffffa28);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(in_stack_fffffffffffffa28);
    __first_02._M_current._7_1_ = in_stack_fffffffffffffa87;
    __first_02._M_current._0_7_ = in_stack_fffffffffffffa80;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (pvVar9,in_stack_fffffffffffffa88,__first_02,in_stack_fffffffffffffa78);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_38);
    if (sVar6 == 0) {
      __assert_fail("memory.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                    ,0x27a2,
                    "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                   );
    }
    pvVar9 = &local_38;
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(pvVar9);
    pvVar10 = malloc(sVar6);
    *local_18 = pvVar10;
    pvVar10 = (void *)*local_18;
    this_00 = (vector<long_long,_std::allocator<long_long>_> *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                        (pvVar9,(size_type)in_stack_fffffffffffffa28);
    sVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_38);
    memcpy(pvVar10,this_00,sVar6);
    local_8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
    std::vector<long_long,_std::allocator<long_long>_>::~vector(this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  }
  return local_8;
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlineBlocks =
      16; // 1 for no compress & ZIPS, 16 for ZIP compression.

  // Write attributes.
  {
    std::vector<unsigned char> data;

    std::vector<ChannelInfo> channels;
    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int compressionType = 3; // ZIP compression
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&compressionType));
    }
    WriteAttributeToMemory(
        memory, "compression", "compression",
        reinterpret_cast<const unsigned char *>(&compressionType), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    printf("custom\n");
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name, exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(&exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
        
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlineBlocks * i;
    int endY = (std::min)(numScanlineBlocks * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
    unsigned long long outSize = block.size();

    CompressZip(&block.at(0), outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size());

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    std::vector<unsigned char> header(8);
    unsigned int dataLen = outSize; // truncate
    memcpy(&header.at(0), &startY, sizeof(int));
    memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
      swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
    }

    dataList[i].insert(dataList[i].end(), header.begin(), header.end());
    dataList[i].insert(dataList[i].end(), block.begin(),
                       block.begin() + dataLen);

    // data.insert(data.end(), header.begin(), header.end());
    // data.insert(data.end(), block.begin(), block.begin() + dataLen);

    // offsets[i] = offset;
    // if (IsBigEndian()) {
    //  swap8(reinterpret_cast<unsigned long long*>(&offsets[i]));
    //}
    // offset += dataLen + 8; // 8 = sizeof(blockHeader)
  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}